

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hello_world.cpp
# Opt level: O2

void __thiscall my_form::my_form(my_form *this)

{
  text *this_00;
  numeric<double> *this_01;
  password *this_02;
  select_multiple *this_03;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  long lVar4;
  password *ppVar5;
  allocator local_1b0 [15];
  allocator local_1a1;
  string *local_1a0;
  basic_message *local_198;
  basic_message *local_190;
  basic_message<char> local_188;
  regex *local_108;
  password *local_100;
  textarea *local_f8;
  hidden *local_f0;
  password *local_e8;
  numeric<double> *local_e0;
  text *local_d8;
  string local_d0 [32];
  string local_b0 [32];
  string local_90 [32];
  string local_70 [32];
  string local_50 [32];
  
  cppcms::form::form(&this->super_form);
  *(undefined ***)this = &PTR_render_0012d708;
  this_00 = &this->name;
  cppcms::widgets::text::text(this_00);
  this_01 = &this->age;
  local_d8 = this_00;
  cppcms::widgets::numeric<double>::numeric(this_01);
  this_02 = &this->p1;
  local_e0 = this_01;
  cppcms::widgets::password::password(this_02);
  local_e8 = this_02;
  cppcms::widgets::password::password(&this->p2);
  local_f8 = &this->description;
  local_100 = &this->p2;
  cppcms::widgets::textarea::textarea(local_f8);
  this_03 = &this->sel;
  cppcms::widgets::select_multiple::select_multiple(this_03);
  local_190 = (basic_message *)&this->sel1;
  cppcms::widgets::radio::radio((radio *)local_190);
  local_198 = (basic_message *)&this->sel2;
  cppcms::widgets::select::select((select *)local_198);
  local_1a0 = (string *)&this->gif;
  cppcms::widgets::file::file((file *)local_1a0);
  local_108 = (regex *)&this->text;
  cppcms::widgets::file::file((file *)local_108);
  local_f0 = &this->secret;
  cppcms::widgets::hidden::hidden(local_f0);
  lVar4 = *(long *)(*(long *)this_00 + -0x18);
  std::__cxx11::string::string(local_50,"Your Name",(allocator *)&local_188);
  cppcms::widgets::base_widget::message(this_00 + lVar4,local_50);
  std::__cxx11::string::~string(local_50);
  cppcms::widgets::base_text::limits((int)this + 0x60,2);
  lVar4 = *(long *)(*(long *)this_01 + -0x18);
  std::__cxx11::string::string(local_70,"Your Age",(allocator *)&local_188);
  cppcms::widgets::base_widget::message(&this_01->super_base_html_input + lVar4,local_70);
  std::__cxx11::string::~string(local_70);
  (this->age).check_low_ = true;
  (this->age).check_high_ = true;
  *(undefined4 *)&(this->age).min_ = 0;
  *(undefined4 *)((long)&(this->age).min_ + 4) = 0;
  *(undefined4 *)&(this->age).max_ = 0;
  *(undefined4 *)((long)&(this->age).max_ + 4) = 0x405e0000;
  (this->age).non_empty_ = true;
  lVar4 = *(long *)(*(long *)&this->description + -0x18);
  std::__cxx11::string::string(local_90,"Describe Yourself",(allocator *)&local_188);
  cppcms::widgets::base_widget::message(local_f8 + lVar4,local_90);
  std::__cxx11::string::~string(local_90);
  lVar4 = *(long *)(*(long *)this_02 + -0x18);
  std::__cxx11::string::string(local_b0,"Password",(allocator *)&local_188);
  cppcms::widgets::base_widget::message(this_02 + lVar4,local_b0);
  std::__cxx11::string::~string(local_b0);
  ppVar5 = local_100;
  lVar4 = *(long *)(*(long *)local_100 + -0x18);
  std::__cxx11::string::string(local_d0,"Confirm",(allocator *)&local_188);
  cppcms::widgets::base_widget::message(ppVar5 + lVar4,local_d0);
  std::__cxx11::string::~string(local_d0);
  cppcms::widgets::password::check_equal(this_02);
  cppcms::widgets::base_text::non_empty();
  paVar1 = &local_188.id_.field_2;
  local_188.n_ = 0;
  local_188.c_id_ = "Files:";
  local_188.c_context_ = (char_type *)0x0;
  local_188.c_plural_ = (char_type *)0x0;
  local_188.id_._M_string_length = 0;
  local_188.id_.field_2._M_local_buf[0] = '\0';
  paVar2 = &local_188.context_.field_2;
  local_188.context_._M_string_length = 0;
  local_188.context_.field_2._M_local_buf[0] = '\0';
  paVar3 = &local_188.plural_.field_2;
  local_188.plural_._M_string_length = 0;
  local_188.plural_.field_2._M_local_buf[0] = '\0';
  local_188.id_._M_dataplus._M_p = (pointer)paVar1;
  local_188.context_._M_dataplus._M_p = (pointer)paVar2;
  local_188.plural_._M_dataplus._M_p = (pointer)paVar3;
  cppcms::widgets::base_widget::message((basic_message *)this_03);
  booster::locale::basic_message<char>::~basic_message(&local_188);
  std::__cxx11::string::string((string *)&local_188,"Foo",local_1b0);
  cppcms::widgets::select_multiple::add((string *)this_03,SUB81(&local_188,0));
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string((string *)&local_188,"Bar",local_1b0);
  cppcms::widgets::select_multiple::add((string *)this_03,SUB81(&local_188,0));
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string((string *)&local_188,"Bee",local_1b0);
  cppcms::widgets::select_multiple::add((string *)this_03,SUB81(&local_188,0));
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string((string *)&local_188,"Car",local_1b0);
  cppcms::widgets::select_multiple::add((string *)this_03,SUB81(&local_188,0));
  std::__cxx11::string::~string((string *)&local_188);
  local_188.n_ = 0;
  local_188.c_id_ = "Fruit";
  local_188.c_context_ = (char_type *)0x0;
  local_188.c_plural_ = (char_type *)0x0;
  local_188.id_._M_string_length = 0;
  local_188.id_.field_2._M_local_buf[0] = '\0';
  local_188.context_._M_string_length = 0;
  local_188.context_.field_2._M_local_buf[0] = '\0';
  local_188.plural_._M_string_length = 0;
  local_188.plural_.field_2._M_local_buf[0] = '\0';
  local_188.id_._M_dataplus._M_p = (pointer)paVar1;
  local_188.context_._M_dataplus._M_p = (pointer)paVar2;
  local_188.plural_._M_dataplus._M_p = (pointer)paVar3;
  cppcms::widgets::base_widget::message(local_190);
  booster::locale::basic_message<char>::~basic_message(&local_188);
  std::__cxx11::string::string((string *)&local_188,"Apple",local_1b0);
  cppcms::widgets::select_base::add((string *)local_190);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string((string *)&local_188,"Orange",local_1b0);
  cppcms::widgets::select_base::add((string *)local_190);
  std::__cxx11::string::~string((string *)&local_188);
  local_188.n_ = 0;
  local_188.c_id_ = "Sex";
  local_188.c_context_ = (char_type *)0x0;
  local_188.c_plural_ = (char_type *)0x0;
  local_188.id_._M_string_length = 0;
  local_188.id_.field_2._M_local_buf[0] = '\0';
  local_188.context_._M_string_length = 0;
  local_188.context_.field_2._M_local_buf[0] = '\0';
  local_188.plural_._M_string_length = 0;
  local_188.plural_.field_2._M_local_buf[0] = '\0';
  local_188.id_._M_dataplus._M_p = (pointer)paVar1;
  local_188.context_._M_dataplus._M_p = (pointer)paVar2;
  local_188.plural_._M_dataplus._M_p = (pointer)paVar3;
  cppcms::widgets::base_widget::message(local_198);
  booster::locale::basic_message<char>::~basic_message(&local_188);
  std::__cxx11::string::string((string *)&local_188,"Male",local_1b0);
  cppcms::widgets::select_base::add((string *)local_198);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string((string *)&local_188,"Femail",local_1b0);
  cppcms::widgets::select_base::add((string *)local_198);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string((string *)&local_188,"You are sexist",local_1b0);
  cppcms::widgets::select_base::add((string *)local_198);
  std::__cxx11::string::~string((string *)&local_188);
  cppcms::widgets::select_multiple::at_least((uint)this_03);
  cppcms::widgets::select_base::non_empty();
  cppcms::widgets::file::non_empty();
  std::__cxx11::string::string((string *)&local_188,"GIF89a",local_1b0);
  cppcms::widgets::file::add_valid_magic(local_1a0);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string((string *)&local_188,"GIF87a",local_1b0);
  cppcms::widgets::file::add_valid_magic(local_1a0);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string((string *)&local_188,anon_var_dwarf_d78f,local_1b0);
  cppcms::widgets::file::add_valid_magic(local_1a0);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::string((string *)&local_188,"text/.*",&local_1a1);
  booster::regex::regex((regex *)local_1b0,(string *)&local_188,0);
  cppcms::widgets::file::mime(local_108);
  booster::regex::~regex((regex *)local_1b0);
  std::__cxx11::string::~string((string *)&local_188);
  cppcms::form::add((base_widget *)this);
  cppcms::form::add((base_widget *)this);
  cppcms::form::add((base_widget *)this);
  cppcms::form::add((base_widget *)this);
  cppcms::form::add((base_widget *)this);
  cppcms::form::add((base_widget *)this);
  cppcms::form::add((base_widget *)this);
  cppcms::form::add((base_widget *)this);
  cppcms::form::add((base_widget *)this);
  cppcms::form::add((base_widget *)this);
  cppcms::form::add((base_widget *)this);
  return;
}

Assistant:

my_form()
	{
		name.message("Your Name");
		name.limits(2,30);
		age.message("Your Age");
		age.range(0,120);
		description.message("Describe Yourself");
		p1.message("Password");
		p2.message("Confirm");
		p1.check_equal(p2);
		p1.non_empty();
		sel.message(cppcms::locale::translate("Files:"));
		sel.add("Foo");
		sel.add("Bar");
		sel.add("Bee");
		sel.add("Car");
		sel1.message(cppcms::locale::translate("Fruit"));
		sel1.add("Apple");
		sel1.add("Orange");
		sel2.message(cppcms::locale::translate("Sex"));
		sel2.add("Male");
		sel2.add("Femail");
		sel2.add("You are sexist");
		sel.at_least(2);
		sel1.non_empty();
		gif.non_empty();
		gif.add_valid_magic("GIF89a");
		gif.add_valid_magic("GIF87a");
		gif.add_valid_magic("\x89PNG\r\n\x1a\n");
		text.mime(booster::regex("text/.*"));
		add(name);
		add(age);
		add(p1);
		add(p2);
		add(description);
		add(sel);
		add(sel1);
		add(sel2);
		add(gif);
		add(text);
		add(secret);
	}